

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O3

int __thiscall cppcms::http::impl::file_buffer::underflow(file_buffer *this)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  uint uVar4;
  long __off;
  byte *__ptr;
  
  if (this->in_memory_ == true) {
    __ptr = (byte *)((*(long *)&this->field_0x10 - *(long *)&this->field_0x8) +
                    *(long *)&this->field_0x20);
    pbVar3 = *(byte **)&this->field_0x28;
    *(long *)&this->field_0x8 = *(long *)&this->field_0x20;
  }
  else {
    iVar1 = (**(code **)(*(long *)this + 0x30))(this);
    if (iVar1 < 0) {
      return -1;
    }
    __off = (*(long *)&this->field_0x10 - *(long *)&this->field_0x8) + this->read_offset_;
    this->read_offset_ = __off;
    iVar1 = fseeko((FILE *)this->f_,__off,0);
    if (iVar1 != 0) {
      return -1;
    }
    std::vector<char,_std::allocator<char>_>::resize(&this->input_,0x400);
    __ptr = (byte *)(this->input_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    sVar2 = fread(__ptr,1,0x400,(FILE *)this->f_);
    pbVar3 = __ptr + sVar2;
    *(byte **)&this->field_0x8 = __ptr;
  }
  *(byte **)&this->field_0x10 = __ptr;
  *(byte **)&this->field_0x18 = pbVar3;
  if (__ptr == pbVar3) {
    uVar4 = 0xffffffff;
  }
  else {
    uVar4 = (uint)*__ptr;
  }
  return uVar4;
}

Assistant:

int underflow()
	{
		if(in_memory_) {
			size_t read_size = gptr() - eback();
			setg(pbase(),pbase()+read_size,pptr());
		}
		else {
			if(sync() < 0)
				return -1;
			read_offset_ += gptr() - eback();
			if(fseeko(f_,read_offset_,SEEK_SET)!=0)
				return -1;
			input_.resize(buffer_size);
			char *input_data = &input_[0];
			size_t n = fread(input_data,1,buffer_size,f_);
			setg(input_data,input_data,input_data+n);
		}
		if(gptr()==egptr())
			return -1;
		return std::char_traits<char>::to_int_type(*gptr());
	}